

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
fmt::BasicWriter<wchar_t>::write_int<long_long,fmt::FormatSpec>
          (BasicWriter<wchar_t> *this,longlong value,FormatSpec spec)

{
  ThousandsSep thousands_sep;
  char code;
  undefined4 uVar1;
  uint uVar2;
  CharPtr pwVar3;
  uint64_t uVar4;
  ulong uVar5;
  lconv *plVar6;
  uint uVar7;
  char *pcVar8;
  bool bVar9;
  StringRef SVar10;
  char prefix [4];
  uint uStack_34;
  
  uVar1 = spec._20_4_;
  prefix[0] = '\0';
  prefix[1] = '\0';
  prefix[2] = '\0';
  prefix[3] = '\0';
  if (value < 0) {
    prefix[0] = '-';
    prefix[1] = '\0';
    prefix[2] = '\0';
    prefix[3] = '\0';
    value = -value;
LAB_001d6f35:
    uVar7 = 1;
  }
  else {
    uVar7 = 0;
    if (((undefined1  [24])spec & (undefined1  [24])0x100000000) != (undefined1  [24])0x0) {
      prefix[0] = 0x2b;
      if (((undefined1  [24])spec & (undefined1  [24])0x200000000) == (undefined1  [24])0x0) {
        prefix[0] = 0x20;
      }
      prefix[1] = '\0';
      prefix[2] = '\0';
      prefix[3] = '\0';
      goto LAB_001d6f35;
    }
  }
  code = spec.type_;
  spec._20_4_ = uVar1;
  if (spec.type_ == '\0') {
LAB_001d6f78:
    uVar2 = internal::count_digits(value);
    pwVar3 = prepare_int_buffer<fmt::FormatSpec>(this,uVar2,&spec,prefix,uVar7);
    internal::format_decimal<unsigned_long,wchar_t,fmt::internal::NoThousandsSep>
              (pwVar3 + 1,value,0);
    return;
  }
  if (spec.type_ == 'B') {
LAB_001d6fa8:
    uVar2 = uVar7;
    if (((undefined1  [24])spec & (undefined1  [24])0x800000000) != (undefined1  [24])0x0) {
      prefix[uVar7] = '0';
      uVar2 = uVar7 | 2;
      prefix[(ulong)uVar7 + 1] = spec.type_;
    }
    uVar7 = 0;
    uVar4 = value;
    do {
      uVar7 = uVar7 + 1;
      bVar9 = 1 < uVar4;
      uVar4 = uVar4 >> 1;
    } while (bVar9);
    pwVar3 = prepare_int_buffer<fmt::FormatSpec>(this,uVar7,&spec,prefix,uVar2);
    do {
      *pwVar3 = (uint)value & 1 | 0x30;
      pwVar3 = pwVar3 + -1;
      bVar9 = 1 < (ulong)value;
      value = (ulong)value >> 1;
    } while (bVar9);
  }
  else {
    if (spec.type_ != 'X') {
      if (spec.type_ == 'b') goto LAB_001d6fa8;
      if (spec.type_ != 'x') {
        if (spec.type_ == 'n') {
          uVar2 = internal::count_digits(value);
          plVar6 = localeconv();
          SVar10 = internal::thousands_sep<lconv>(plVar6);
          pwVar3 = prepare_int_buffer<fmt::FormatSpec>
                             (this,(int)SVar10.size_ * ((uVar2 - 1) / 3) + uVar2,&spec,prefix,uVar7)
          ;
          thousands_sep._16_8_ = (ulong)uStack_34 << 0x20;
          thousands_sep.sep_ = SVar10;
          internal::format_decimal<unsigned_long,wchar_t,fmt::internal::ThousandsSep>
                    (pwVar3 + 1,value,0,thousands_sep);
          return;
        }
        if (spec.type_ == 'o') {
          if (((undefined1  [24])spec & (undefined1  [24])0x800000000) != (undefined1  [24])0x0) {
            uVar5 = (ulong)uVar7;
            uVar7 = uVar7 + 1;
            prefix[uVar5] = '0';
          }
          uVar2 = 0;
          uVar4 = value;
          do {
            uVar2 = uVar2 + 1;
            bVar9 = 7 < uVar4;
            uVar4 = uVar4 >> 3;
          } while (bVar9);
          pwVar3 = prepare_int_buffer<fmt::FormatSpec>(this,uVar2,&spec,prefix,uVar7);
          do {
            *pwVar3 = (uint)value & 7 | 0x30;
            pwVar3 = pwVar3 + -1;
            bVar9 = 7 < (ulong)value;
            value = (ulong)value >> 3;
          } while (bVar9);
          return;
        }
        if (spec.type_ != 'd') {
          pcVar8 = "char";
          if (((undefined1  [24])spec & (undefined1  [24])0x1000000000) == (undefined1  [24])0x0) {
            pcVar8 = "integer";
          }
          internal::report_unknown_type(code,pcVar8);
        }
        goto LAB_001d6f78;
      }
    }
    uVar2 = uVar7;
    if (((undefined1  [24])spec & (undefined1  [24])0x800000000) != (undefined1  [24])0x0) {
      prefix[uVar7] = '0';
      uVar2 = uVar7 | 2;
      prefix[(ulong)uVar7 + 1] = spec.type_;
    }
    uVar7 = 0;
    uVar4 = value;
    do {
      uVar7 = uVar7 + 1;
      bVar9 = 0xf < uVar4;
      uVar4 = uVar4 >> 4;
    } while (bVar9);
    pwVar3 = prepare_int_buffer<fmt::FormatSpec>(this,uVar7,&spec,prefix,uVar2);
    pcVar8 = "0123456789ABCDEF";
    if (spec.type_ == 'x') {
      pcVar8 = "0123456789abcdef";
    }
    do {
      *pwVar3 = (int)pcVar8[(uint)value & 0xf];
      pwVar3 = pwVar3 + -1;
      bVar9 = 0xf < (ulong)value;
      value = (ulong)value >> 4;
    } while (bVar9);
  }
  return;
}

Assistant:

void BasicWriter<Char>::write_int(T value, Spec spec) {
  unsigned prefix_size = 0;
  typedef typename internal::IntTraits<T>::MainType UnsignedType;
  UnsignedType abs_value = static_cast<UnsignedType>(value);
  char prefix[4] = "";
  if (internal::is_negative(value)) {
    prefix[0] = '-';
    ++prefix_size;
    abs_value = 0 - abs_value;
  } else if (spec.flag(SIGN_FLAG)) {
    prefix[0] = spec.flag(PLUS_FLAG) ? '+' : ' ';
    ++prefix_size;
  }
  switch (spec.type()) {
  case 0: case 'd': {
    unsigned num_digits = internal::count_digits(abs_value);
    CharPtr p = prepare_int_buffer(num_digits, spec, prefix, prefix_size) + 1;
    internal::format_decimal(get(p), abs_value, 0);
    break;
  }
  case 'x': case 'X': {
    UnsignedType n = abs_value;
    if (spec.flag(HASH_FLAG)) {
      prefix[prefix_size++] = '0';
      prefix[prefix_size++] = spec.type();
    }
    unsigned num_digits = 0;
    do {
      ++num_digits;
    } while ((n >>= 4) != 0);
    Char *p = get(prepare_int_buffer(
      num_digits, spec, prefix, prefix_size));
    n = abs_value;
    const char *digits = spec.type() == 'x' ?
        "0123456789abcdef" : "0123456789ABCDEF";
    do {
      *p-- = digits[n & 0xf];
    } while ((n >>= 4) != 0);
    break;
  }
  case 'b': case 'B': {
    UnsignedType n = abs_value;
    if (spec.flag(HASH_FLAG)) {
      prefix[prefix_size++] = '0';
      prefix[prefix_size++] = spec.type();
    }
    unsigned num_digits = 0;
    do {
      ++num_digits;
    } while ((n >>= 1) != 0);
    Char *p = get(prepare_int_buffer(num_digits, spec, prefix, prefix_size));
    n = abs_value;
    do {
      *p-- = static_cast<Char>('0' + (n & 1));
    } while ((n >>= 1) != 0);
    break;
  }
  case 'o': {
    UnsignedType n = abs_value;
    if (spec.flag(HASH_FLAG))
      prefix[prefix_size++] = '0';
    unsigned num_digits = 0;
    do {
      ++num_digits;
    } while ((n >>= 3) != 0);
    Char *p = get(prepare_int_buffer(num_digits, spec, prefix, prefix_size));
    n = abs_value;
    do {
      *p-- = static_cast<Char>('0' + (n & 7));
    } while ((n >>= 3) != 0);
    break;
  }
  case 'n': {
    unsigned num_digits = internal::count_digits(abs_value);
    fmt::StringRef sep = "";
#ifndef ANDROID
    sep = internal::thousands_sep(std::localeconv());
#endif
    unsigned size = static_cast<unsigned>(
          num_digits + sep.size() * ((num_digits - 1) / 3));
    CharPtr p = prepare_int_buffer(size, spec, prefix, prefix_size) + 1;
    internal::format_decimal(get(p), abs_value, 0, internal::ThousandsSep(sep));
    break;
  }
  default:
    internal::report_unknown_type(
      spec.type(), spec.flag(CHAR_FLAG) ? "char" : "integer");
    break;
  }
}